

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
__thiscall
Storage::Encodings::MFM::GetFMEncoder
          (MFM *this,vector<bool,_std::allocator<bool>_> *target,
          vector<bool,_std::allocator<bool>_> *fuzzy_target)

{
  undefined1 local_20 [16];
  
  local_20._8_8_ = fuzzy_target;
  std::
  make_unique<FMEncoder,std::vector<bool,std::allocator<bool>>&,std::vector<bool,std::allocator<bool>>*&>
            ((vector<bool,_std::allocator<bool>_> *)local_20,
             (vector<bool,_std::allocator<bool>_> **)target);
  *(undefined8 *)this = local_20._0_8_;
  return (__uniq_ptr_data<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>,_true,_true>
          )(__uniq_ptr_data<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Encoder> Storage::Encodings::MFM::GetFMEncoder(std::vector<bool> &target, std::vector<bool> *fuzzy_target) {
	return std::make_unique<FMEncoder>(target, fuzzy_target);
}